

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.cpp
# Opt level: O2

void __thiscall
sai::Document::IterateLayerFiles(Document *this,function<bool_(sai::VirtualFileEntry_&)> *LayerProc)

{
  uint uVar1;
  LayerTableEntry LVar2;
  bool bVar3;
  char LayerPath [32];
  optional<sai::VirtualFileEntry> LayerTableFile;
  optional<sai::VirtualFileEntry> LayerFile;
  
  VirtualFileSystem::GetEntry(&LayerTableFile,&this->super_VirtualFileSystem,"laytbl");
  if (LayerTableFile.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
      super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
      super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged == true) {
    uVar1 = VirtualFileEntry::Read<unsigned_int>((VirtualFileEntry *)&LayerTableFile);
    while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
      LVar2 = VirtualFileEntry::Read<sai::LayerTableEntry>((VirtualFileEntry *)&LayerTableFile);
      LayerPath[0x10] = '\0';
      LayerPath[0x11] = '\0';
      LayerPath[0x12] = '\0';
      LayerPath[0x13] = '\0';
      LayerPath[0x14] = '\0';
      LayerPath[0x15] = '\0';
      LayerPath[0x16] = '\0';
      LayerPath[0x17] = '\0';
      LayerPath[0x18] = '\0';
      LayerPath[0x19] = '\0';
      LayerPath[0x1a] = '\0';
      LayerPath[0x1b] = '\0';
      LayerPath[0x1c] = '\0';
      LayerPath[0x1d] = '\0';
      LayerPath[0x1e] = '\0';
      LayerPath[0x1f] = '\0';
      LayerPath[0] = '\0';
      LayerPath[1] = '\0';
      LayerPath[2] = '\0';
      LayerPath[3] = '\0';
      LayerPath[4] = '\0';
      LayerPath[5] = '\0';
      LayerPath[6] = '\0';
      LayerPath[7] = '\0';
      LayerPath[8] = '\0';
      LayerPath[9] = '\0';
      LayerPath[10] = '\0';
      LayerPath[0xb] = '\0';
      LayerPath[0xc] = '\0';
      LayerPath[0xd] = '\0';
      LayerPath[0xe] = '\0';
      LayerPath[0xf] = '\0';
      snprintf(LayerPath,0x20,"/layers/%08x",(ulong)LVar2 & 0xffffffff);
      VirtualFileSystem::GetEntry(&LayerFile,&this->super_VirtualFileSystem,LayerPath);
      if (LayerFile.super__Optional_base<sai::VirtualFileEntry,_false,_false>._M_payload.
          super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
          super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged == true) {
        bVar3 = std::function<bool_(sai::VirtualFileEntry_&)>::operator()
                          (LayerProc,(VirtualFileEntry *)&LayerFile);
        if (!bVar3) {
          std::_Optional_payload_base<sai::VirtualFileEntry>::_M_reset
                    ((_Optional_payload_base<sai::VirtualFileEntry> *)&LayerFile);
          break;
        }
      }
      std::_Optional_payload_base<sai::VirtualFileEntry>::_M_reset
                ((_Optional_payload_base<sai::VirtualFileEntry> *)&LayerFile);
    }
  }
  std::_Optional_payload_base<sai::VirtualFileEntry>::_M_reset
            ((_Optional_payload_base<sai::VirtualFileEntry> *)&LayerTableFile);
  return;
}

Assistant:

void Document::IterateLayerFiles(const std::function<bool(VirtualFileEntry&)>& LayerProc)
{
	if( std::optional<VirtualFileEntry> LayerTableFile = GetEntry("laytbl"); LayerTableFile )
	{
		std::uint32_t LayerCount = LayerTableFile->Read<std::uint32_t>();
		while( LayerCount-- ) // Read each layer entry
		{
			const LayerTableEntry CurLayerEntry = LayerTableFile->Read<LayerTableEntry>();
			char                  LayerPath[32] = {};
			std::snprintf(LayerPath, 32u, "/layers/%08x", CurLayerEntry.Identifier);
			if( std::optional<VirtualFileEntry> LayerFile = GetEntry(LayerPath); LayerFile )
			{
				if( !LayerProc(*LayerFile) )
					break;
			}
		}
	}
}